

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,write_shape_ini>
          (xr_ini_writer *this,undefined8 *container)

{
  shape_def *psVar1;
  uint32_t id;
  shape_def *s;
  write_shape_ini local_29;
  
  psVar1 = (shape_def *)container[1];
  id = 0;
  for (s = (shape_def *)*container; s != psVar1; s = s + 1) {
    write_shape_ini::operator()(&local_29,s,this,id);
    id = id + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}